

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::ParametricTypename::ParametricTypename
          (ParametricTypename *this,ParametricTypename *typename_)

{
  pointer pTVar1;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloneables;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_40;
  unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_> local_28;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_20;
  ParametricTypename *local_18;
  ParametricTypename *typename__local;
  ParametricTypename *this_local;
  
  local_18 = typename_;
  typename__local = this;
  pTVar1 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&typename_->m_constructorTypename);
  (*pTVar1->_vptr_Typename[2])();
  std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
  unique_ptr<enact::Typename,std::default_delete<enact::Typename>,void>
            ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
             &local_20,&local_28);
  cloneAll<enact::Typename_const>(&local_40,(enact *)&local_18->m_parameterTypenames,cloneables);
  ParametricTypename(this,&local_20,&local_40);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&local_40);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

ParametricTypename::ParametricTypename(const ParametricTypename &typename_) :
            ParametricTypename{
                    typename_.m_constructorTypename->clone(),
                    cloneAll(typename_.m_parameterTypenames)} {
    }